

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O3

UINT8 __thiscall GYMPlayer::LoadTags(GYMPlayer *this)

{
  pointer *pppcVar1;
  char **ppcVar2;
  iterator __position;
  char *local_18;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->_tagData)._M_t);
  ppcVar2 = (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  __position._M_current =
       (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current != ppcVar2) {
    (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar2;
    __position._M_current = ppcVar2;
  }
  if ((this->_fileHdr).hasHeader != '\0') {
    LoadTag(this,"TITLE",this->_fileData + 4,0x20);
    LoadTag(this,"GAME",this->_fileData + 0x24,0x20);
    LoadTag(this,"PUBLISHER",this->_fileData + 0x44,0x20);
    LoadTag(this,"EMULATOR",this->_fileData + 100,0x20);
    LoadTag(this,"ENCODED_BY",this->_fileData + 0x84,0x20);
    LoadTag(this,"COMMENT",this->_fileData + 0xa4,0x100);
    __position._M_current =
         (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  local_18 = (char *)0x0;
  if (__position._M_current ==
      (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&this->_tagList,__position,
               &local_18);
  }
  else {
    *__position._M_current = (char *)0x0;
    pppcVar1 = &(this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  return '\0';
}

Assistant:

UINT8 GYMPlayer::LoadTags(void)
{
	_tagData.clear();
	_tagList.clear();
	if (! _fileHdr.hasHeader)
	{
		_tagList.push_back(NULL);
		return 0x00;
	}
	
	LoadTag("TITLE",        &_fileData[0x04], 0x20);
	LoadTag("GAME",         &_fileData[0x24], 0x20);
	// no "ARTIST" tag in GYMX files
	LoadTag("PUBLISHER",    &_fileData[0x44], 0x20);
	LoadTag("EMULATOR",     &_fileData[0x64], 0x20);
	LoadTag("ENCODED_BY",   &_fileData[0x84], 0x20);
	LoadTag("COMMENT",      &_fileData[0xA4], 0x100);
	
	_tagList.push_back(NULL);
	return 0x00;
}